

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UartSerial.cpp
# Opt level: O1

void __thiscall serial_wiring::UartSerial::begin(UartSerial *this,size_t speed_,size_t config_)

{
  int *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  speed_t __speed;
  char *__s;
  tcflag_t tVar4;
  
  __speed = 0;
  bVar1 = true;
  if ((long)speed_ < 0x2580) {
    if (0x4af < (long)speed_) {
      if (speed_ == 0x4b0) {
        __speed = 9;
      }
      else if (speed_ == 0x960) {
        __speed = 0xb;
      }
      else {
        __speed = 0;
        if (speed_ != 0x12c0) goto LAB_0010e6b5;
        __speed = 0xc;
      }
      goto LAB_0010e6b3;
    }
    if (speed_ == 300) {
      __speed = 7;
      goto LAB_0010e6b3;
    }
    if (speed_ == 600) {
      __speed = 8;
      goto LAB_0010e6b3;
    }
  }
  else {
    if ((long)speed_ < 0x9600) {
      if (speed_ == 0x2580) {
        __speed = 0xd;
      }
      else {
        if (speed_ != 0x4b00) goto LAB_0010e6b5;
        __speed = 0xe;
      }
    }
    else if (speed_ == 0x9600) {
      __speed = 0xf;
    }
    else if (speed_ == 0xe100) {
      __speed = 0x1001;
    }
    else {
      if (speed_ != 0x1c200) goto LAB_0010e6b5;
      __speed = 0x1002;
    }
LAB_0010e6b3:
    bVar1 = false;
  }
LAB_0010e6b5:
  switch(config_ << 0x38 | config_ >> 8) {
  case 0:
    tVar4 = 0xc80;
    break;
  case 1:
    tVar4 = 0xc90;
    break;
  case 2:
    tVar4 = 0xca0;
    break;
  case 3:
    tVar4 = 0xcb0;
    break;
  case 4:
    tVar4 = 0xcc0;
    break;
  case 5:
    tVar4 = 0xcd0;
    break;
  case 6:
    tVar4 = 0xce0;
    break;
  case 7:
    tVar4 = 0xcf0;
    break;
  default:
    tVar4 = 0xc81;
    bVar2 = true;
    goto LAB_0010e7a8;
  case 0x10:
    tVar4 = 0xd80;
    break;
  case 0x11:
    tVar4 = 0xd90;
    break;
  case 0x12:
    tVar4 = 0xda0;
    break;
  case 0x13:
    tVar4 = 0xdb0;
    break;
  case 0x14:
    tVar4 = 0xdc0;
    break;
  case 0x15:
    tVar4 = 0xdd0;
    break;
  case 0x16:
    tVar4 = 0xde0;
    break;
  case 0x17:
    tVar4 = 0xdf0;
    break;
  case 0x30:
    tVar4 = 0xf80;
    break;
  case 0x31:
    tVar4 = 0xf90;
    break;
  case 0x32:
    tVar4 = 4000;
    break;
  case 0x33:
    tVar4 = 0xfb0;
    break;
  case 0x34:
    tVar4 = 0xfc0;
    break;
  case 0x35:
    tVar4 = 0xfd0;
    break;
  case 0x36:
    tVar4 = 0xfe0;
    break;
  case 0x37:
    tVar4 = 0xff0;
  }
  bVar2 = false;
LAB_0010e7a8:
  if (bVar1) {
    __s = "UartSerial::begin - Unsupported baud rate";
  }
  else if (bVar2) {
    __s = "UartSerial::begin - Unsupported configuration";
  }
  else {
    iVar3 = open(this->_serial_device_path,0x102);
    this->_serial_file_descriptor = iVar3;
    if (-1 < iVar3) {
      this_00 = &this->_serial_file_descriptor;
      iVar3 = isatty(iVar3);
      if (iVar3 == 0) {
        begin((UartSerial *)this_00);
      }
      else {
        iVar3 = tcgetattr(this->_serial_file_descriptor,(termios *)&this->_tio_config_original);
        if (iVar3 == 0) {
          iVar3 = tcflush(*this_00,2);
          if (iVar3 == 0) {
            (this->_tio_config).c_cflag = tVar4;
            (this->_tio_config).c_cc[5] = '\0';
            (this->_tio_config).c_cc[6] = '\0';
            iVar3 = cfsetspeed((termios *)&this->_tio_config,__speed);
            if (iVar3 == 0) {
              iVar3 = tcsetattr(*this_00,0,(termios *)&this->_tio_config);
              if (iVar3 != 0) {
                begin((UartSerial *)this_00);
              }
            }
            else {
              begin((UartSerial *)this_00);
            }
          }
          else {
            begin((UartSerial *)this_00);
          }
        }
        else {
          begin((UartSerial *)this_00);
        }
      }
      return;
    }
    __s = this->_serial_device_path;
  }
  perror(__s);
  return;
}

Assistant:

void
UartSerial::begin (
    const size_t speed_,
    const size_t config_
) {
    // Scrubbed parameters
    speed_t baud_rate = B0;
    size_t c_cflags = 0;

    // Interpret common baud rates
    switch (speed_) {
      case 300: baud_rate = B300; break;
      case 600: baud_rate = B600; break;
      case 1200: baud_rate = B1200; break;
      case 2400: baud_rate = B2400; break;
      case 4800: baud_rate = B4800; break;
      case 9600: baud_rate = B9600; break;
      case 14400: break;
      case 19200: baud_rate = B19200; break;
      case 28800: break;
      case 38400: baud_rate = B38400; break;
      case 57600: baud_rate = B57600; break;
      case 115200: baud_rate = B115200; break;
      default: break;
    }

    // Initialize the value for c_cflag with the options needed for the
    // character size, parity and stop bits.
    switch (config_) {
      case wiring::SERIAL_5E1: c_cflags = (CS5|PARENB); break;
      case wiring::SERIAL_5E2: c_cflags = (CS5|PARENB|CSTOPB); break;
      case wiring::SERIAL_5N1: c_cflags = CS5; break;
      case wiring::SERIAL_5N2: c_cflags = (CS5|CSTOPB); break;
      case wiring::SERIAL_5O1: c_cflags = (CS5|PARENB|PARODD); break;
      case wiring::SERIAL_5O2: c_cflags = (CS5|PARENB|PARODD|CSTOPB); break;
      case wiring::SERIAL_6E1: c_cflags = (CS6|PARENB); break;
      case wiring::SERIAL_6E2: c_cflags = (CS6|PARENB|CSTOPB); break;
      case wiring::SERIAL_6N1: c_cflags = CS6; break;
      case wiring::SERIAL_6N2: c_cflags = (CS6|CSTOPB); break;
      case wiring::SERIAL_6O1: c_cflags = (CS6|PARENB|PARODD); break;
      case wiring::SERIAL_6O2: c_cflags = (CS6|PARENB|PARODD|CSTOPB); break;
      case wiring::SERIAL_7E1: c_cflags = (CS7|PARENB); break;
      case wiring::SERIAL_7E2: c_cflags = (CS7|PARENB|CSTOPB); break;
      case wiring::SERIAL_7N1: c_cflags = CS7; break;
      case wiring::SERIAL_7N2: c_cflags = (CS7|CSTOPB); break;
      case wiring::SERIAL_7O1: c_cflags = (CS7|PARENB|PARODD); break;
      case wiring::SERIAL_7O2: c_cflags = (CS7|PARENB|PARODD|CSTOPB); break;
      case wiring::SERIAL_8E1: c_cflags = (CS8|PARENB); break;
      case wiring::SERIAL_8E2: c_cflags = (CS8|PARENB|CSTOPB); break;
      case wiring::SERIAL_8N1: c_cflags = CS8; break;
      case wiring::SERIAL_8N2: c_cflags = (CS8|CSTOPB); break;
      case wiring::SERIAL_8O1: c_cflags = (CS8|PARENB|PARODD); break;
      case wiring::SERIAL_8O2: c_cflags = (CS8|PARENB|PARODD|CSTOPB); break;
      default: c_cflags = SERIAL_CONFIG_INVALID; break;
    }

    // Validate baud rate
    if ( B0 == baud_rate ) {
        ::perror("UartSerial::begin - Unsupported baud rate");
    // Validate configuration flags
    } else if ( SERIAL_CONFIG_INVALID == c_cflags ) {
        ::perror("UartSerial::begin - Unsupported configuration");
    // Attempt to open the device
    } else if ( 0 > (_serial_file_descriptor = ::open(_serial_device_path, (O_RDWR|O_NOCTTY))) ) {
        ::perror(_serial_device_path);
    // Confirm file descriptor is a TTY device
    } else if ( 0 == ::isatty(_serial_file_descriptor) ) {
        ::perror("UartSerial::begin - File descriptor is not a TTY device");
        if ( 0 != cleanupSerialFileDescriptor() ) {
            ::perror("UartSerial::begin - Unable to close serial file descriptor");
        }
    // Save current device settings
    } else if ( 0 != ::tcgetattr(_serial_file_descriptor, &_tio_config_original) ) {
        ::perror("UartSerial::begin - Unable to save current term attributes");
        if ( 0 != cleanupSerialFileDescriptor() ) {
          ::perror("UartSerial::begin - Unable to close serial file descriptor");
        }
    // Flush all current i/o data before enabling the new configuration
    } else if ( 0 != ::tcflush(_serial_file_descriptor, TCIOFLUSH) ) {
        ::perror("UartSerial::begin - Unable to flush file descriptor");
        if ( 0 != cleanupSerialFileDescriptor() ) {
            ::perror("UartSerial::begin - Unable to close serial file descriptor");
        }
    } else {
        // Configure the termios structure. See termios man page for further info
        // http://man7.org/linux/man-pages/man3/termios.3.html

        // c_iflag - input modes
        // Leave all input flags unset

        // c_oflag - output modes
        // Leave all output flags unset

        // c_cflag - control modes
        _tio_config.c_cflag = c_cflags;
        _tio_config.c_cflag |= CREAD;   // Enable receiver
        _tio_config.c_cflag |= CLOCAL;  // Ignore modem control lines
        _tio_config.c_cflag |= HUPCL;  // Enable hang-up on close

        // c_lflag - local modes
        // Leave all local mode flags unset. This enables noncanonical mode input.

        // c_cc - special characters
        // The following combination of VTIME and VMIN will result in a polling
        // read. If data is available a call to read() returns immediately. If
        // no data is available a call to read() returns 0.
        _tio_config.c_cc[VTIME] = 0;
        _tio_config.c_cc[VMIN] = 0;

        // Update configuration
        if ( 0 != ::cfsetspeed(&_tio_config, baud_rate) ) {
            ::perror("UartSerial::begin - Unable to set baud rate");
            if ( 0 != cleanupSerialFileDescriptor() ) {
                ::perror("UartSerial::begin - Unable to close serial file descriptor");
            }
        // Enable new term configuration
        } else if ( 0 != ::tcsetattr(_serial_file_descriptor, TCSANOW, &_tio_config) ) {
            ::perror("UartSerial::begin - Unable to set term attributes");
            if ( 0 != cleanupSerialFileDescriptor() ) {
                ::perror("UartSerial::begin - Unable to close serial file descriptor");
            }
        }
    }
}